

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc.h
# Opt level: O2

void foreach_overlappable_nb_above
               (AV1_COMMON *cm,MACROBLOCKD *xd,int nb_max,overlappable_nb_visitor_t fun,
               void *fun_ctxt)

{
  uint8_t uVar1;
  undefined1 uVar2;
  uint uVar3;
  MB_MODE_INFO **ppMVar4;
  MB_MODE_INFO *pMVar5;
  long lVar6;
  byte bVar7;
  long lVar8;
  byte bVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  
  if (xd->up_available == true) {
    uVar1 = cm->seq_params->monochrome;
    uVar3 = xd->mi_col;
    lVar10 = (long)(int)uVar3;
    ppMVar4 = xd->mi;
    lVar8 = (long)xd->mi_stride;
    iVar15 = xd->width + uVar3;
    iVar14 = (cm->mi_params).mi_cols;
    if (iVar14 <= iVar15) {
      iVar15 = iVar14;
    }
    iVar14 = 0;
    uVar11 = uVar3;
    while (((int)uVar11 < iVar15 && (iVar14 < nb_max))) {
      uVar13 = (ulong)ppMVar4[((int)uVar11 - lVar8) - lVar10]->bsize;
      bVar9 = 0x10;
      if ((0x1f07ffUL >> (uVar13 & 0x3f) & 1) != 0) {
        bVar9 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar13]
        ;
      }
      lVar6 = ((int)uVar11 - lVar8) - lVar10;
      uVar12 = uVar11 & 0xfffffffe;
      if (bVar9 == 1) {
        bVar9 = 2;
        uVar11 = uVar12;
        lVar6 = (((long)(int)uVar12 + 1) - lVar8) - lVar10;
      }
      pMVar5 = ppMVar4[lVar6];
      if (((pMVar5->field_0xa7 & 0x80) != 0) || ('\0' < pMVar5->ref_frame[0])) {
        iVar14 = iVar14 + 1;
        uVar2 = xd->width;
        bVar7 = uVar2;
        if (bVar9 <= (byte)uVar2) {
          bVar7 = bVar9;
        }
        (*fun)(xd,0,uVar11 - uVar3,bVar7,0,pMVar5,fun_ctxt,SUB14(uVar1 == '\0',0) * 2 + 1);
      }
      uVar11 = uVar11 + bVar9;
    }
  }
  return;
}

Assistant:

static inline void foreach_overlappable_nb_above(const AV1_COMMON *cm,
                                                 MACROBLOCKD *xd, int nb_max,
                                                 overlappable_nb_visitor_t fun,
                                                 void *fun_ctxt) {
  if (!xd->up_available) return;

  const int num_planes = av1_num_planes(cm);
  int nb_count = 0;
  const int mi_col = xd->mi_col;
  // prev_row_mi points into the mi array, starting at the beginning of the
  // previous row.
  MB_MODE_INFO **prev_row_mi = xd->mi - mi_col - 1 * xd->mi_stride;
  const int end_col = AOMMIN(mi_col + xd->width, cm->mi_params.mi_cols);
  uint8_t mi_step;
  for (int above_mi_col = mi_col; above_mi_col < end_col && nb_count < nb_max;
       above_mi_col += mi_step) {
    MB_MODE_INFO **above_mi = prev_row_mi + above_mi_col;
    mi_step =
        AOMMIN(mi_size_wide[above_mi[0]->bsize], mi_size_wide[BLOCK_64X64]);
    // If we're considering a block with width 4, it should be treated as
    // half of a pair of blocks with chroma information in the second. Move
    // above_mi_col back to the start of the pair if needed, set above_mbmi
    // to point at the block with chroma information, and set mi_step to 2 to
    // step over the entire pair at the end of the iteration.
    if (mi_step == 1) {
      above_mi_col &= ~1;
      above_mi = prev_row_mi + above_mi_col + 1;
      mi_step = 2;
    }
    if (is_neighbor_overlappable(*above_mi)) {
      ++nb_count;
      fun(xd, 0, above_mi_col - mi_col, AOMMIN(xd->width, mi_step), 0,
          *above_mi, fun_ctxt, num_planes);
    }
  }
}